

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple.cc
# Opt level: O2

void LogText::Log(string *line)

{
  long lVar1;
  ostream *poVar2;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + -8);
  if (lVar1 != 0) {
    std::__cxx11::string::string((string *)&bStack_38,(string *)line);
    std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(lVar1 + 8),
               &bStack_38);
    std::__cxx11::string::~string((string *)&bStack_38);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"*** Not captured: \"");
  poVar2 = std::operator<<(poVar2,(string *)line);
  poVar2 = std::operator<<(poVar2,"\" ***");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

static void Log(std::string line) {
    if (GetCurrent()) {
      GetCurrent()->LogLine(std::move(line));
    } else {
      std::cerr << "*** Not captured: \"" << line << "\" ***" << std::endl;
    }
  }